

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O3

void __thiscall amrex::FabArrayBase::~FabArrayBase(FabArrayBase *this)

{
  ~FabArrayBase(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

FabArrayBase::~FabArrayBase () {}